

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void tcg_gen_exit_tb_m68k(TCGContext_conflict2 *tcg_ctx,TranslationBlock *tb,uint idx)

{
  TCGOp *pTVar1;
  
  pTVar1 = tcg_emit_op_m68k(tcg_ctx,INDEX_op_exit_tb);
  pTVar1->args[0] = (long)tb->page_next + ((ulong)idx - 0x38);
  return;
}

Assistant:

void tcg_gen_exit_tb(TCGContext *tcg_ctx, TranslationBlock *tb, unsigned idx)
{
    uintptr_t val = (uintptr_t)tb + idx;

    if (tb == NULL) {
        tcg_debug_assert(idx == 0);
    } else if (idx <= TB_EXIT_IDXMAX) {
#ifdef CONFIG_DEBUG_TCG
        /* This is an exit following a goto_tb.  Verify that we have
           seen this numbered exit before, via tcg_gen_goto_tb.  */
        tcg_debug_assert(tcg_ctx->goto_tb_issue_mask & (1 << idx));
#endif
        /* When not chaining, exit without indicating a link.  */
        //if (qemu_loglevel_mask(CPU_LOG_TB_NOCHAIN)) {
        //    val = 0;
        //}
    } else {
        /* This is an exit via the exitreq label.  */
        tcg_debug_assert(idx == TB_EXIT_REQUESTED);
    }

    tcg_gen_op1i(tcg_ctx, INDEX_op_exit_tb, val);
}